

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O1

duckdb_state duckdb_query_arrow_array(duckdb_arrow result,duckdb_arrow_array *out_array)

{
  duckdb_arrow result_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ClientContext *context;
  ArrowArray *out_array_00;
  pointer pcVar2;
  bool bVar3;
  pointer pMVar4;
  pointer this;
  ErrorData *error;
  pointer pDVar5;
  type input;
  unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
  extension_type_cast;
  ClientProperties local_88;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  if (out_array != (duckdb_arrow_array *)0x0) {
    pMVar4 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)result);
    result_00 = result + 8;
    this = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)result);
    error = duckdb::BaseQueryResult::GetErrorObject((BaseQueryResult *)this);
    bVar3 = duckdb::QueryResult::TryFetch
                      (&pMVar4->super_QueryResult,
                       (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                        *)result_00,error);
    if (!bVar3) {
      return DuckDBError;
    }
    if (((_Head_base<0UL,_duckdb::DataChunk_*,_false>)
         *(_Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_> *)
          result_00 != (DataChunk *)0x0) &&
       (pDVar5 = duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                 ::operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                               *)result_00), pDVar5->count != 0)) {
      pMVar4 = duckdb::
               unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                             *)result);
      duckdb::optional_ptr<duckdb::ClientContext,_true>::CheckValid
                (&(pMVar4->super_QueryResult).client_properties.client_context);
      context = (pMVar4->super_QueryResult).client_properties.client_context.ptr;
      pMVar4 = duckdb::
               unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                             *)result);
      duckdb::ArrowTypeExtensionData::GetExtensionTypes
                ((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                  *)&local_58,context,&(pMVar4->super_QueryResult).super_BaseQueryResult.types);
      input = duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
              operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)result_00);
      out_array_00 = (ArrowArray *)*out_array;
      pMVar4 = duckdb::
               unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                             *)result);
      paVar1 = &local_88.time_zone.field_2;
      pcVar2 = (pMVar4->super_QueryResult).client_properties.time_zone._M_dataplus._M_p;
      local_88.time_zone._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,
                 pcVar2 + (pMVar4->super_QueryResult).client_properties.time_zone._M_string_length);
      local_88.arrow_offset_size = (pMVar4->super_QueryResult).client_properties.arrow_offset_size;
      local_88.arrow_use_list_view =
           (pMVar4->super_QueryResult).client_properties.arrow_use_list_view;
      local_88.produce_arrow_string_view =
           (pMVar4->super_QueryResult).client_properties.produce_arrow_string_view;
      local_88.arrow_lossless_conversion =
           (pMVar4->super_QueryResult).client_properties.arrow_lossless_conversion;
      local_88._36_4_ = *(undefined4 *)&(pMVar4->super_QueryResult).client_properties.field_0x24;
      local_88.client_context.ptr = (pMVar4->super_QueryResult).client_properties.client_context.ptr
      ;
      duckdb::ArrowConverter::ToArrowArray
                (input,out_array_00,&local_88,
                 (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                  *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.time_zone._M_dataplus._M_p != paVar1) {
        operator_delete(local_88.time_zone._M_dataplus._M_p);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_58);
    }
  }
  return DuckDBSuccess;
}

Assistant:

duckdb_state duckdb_query_arrow_array(duckdb_arrow result, duckdb_arrow_array *out_array) {
	if (!out_array) {
		return DuckDBSuccess;
	}
	auto wrapper = reinterpret_cast<ArrowResultWrapper *>(result);
	auto success = wrapper->result->TryFetch(wrapper->current_chunk, wrapper->result->GetErrorObject());
	if (!success) { // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP
	if (!wrapper->current_chunk || wrapper->current_chunk->size() == 0) {
		return DuckDBSuccess;
	}
	auto extension_type_cast = duckdb::ArrowTypeExtensionData::GetExtensionTypes(
	    *wrapper->result->client_properties.client_context, wrapper->result->types);
	ArrowConverter::ToArrowArray(*wrapper->current_chunk, reinterpret_cast<ArrowArray *>(*out_array),
	                             wrapper->result->client_properties, extension_type_cast);
	return DuckDBSuccess;
}